

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictTrie.hpp
# Opt level: O0

void __thiscall cppjieba::DictTrie::SetStaticWordWeights(DictTrie *this,UserWordWeightOption option)

{
  undefined4 uVar1;
  bool bVar2;
  ostream *poVar3;
  reference pvVar4;
  size_type sVar5;
  int in_ESI;
  __normal_iterator<cppjieba::DictUnit_*,_std::vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>_>
  in_RDI;
  vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_> x;
  vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_> *in_stack_fffffffffffffe08;
  vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_> *this_00;
  Logger *in_stack_fffffffffffffe20;
  __normal_iterator<cppjieba::DictUnit_*,_std::vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>_>
  in_stack_fffffffffffffe28;
  Logger *in_stack_fffffffffffffe40;
  pointer in_stack_fffffffffffffe58;
  vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_> *in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe9c;
  char *in_stack_fffffffffffffea0;
  size_t in_stack_fffffffffffffea8;
  Logger *in_stack_fffffffffffffeb0;
  
  bVar2 = std::vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>::empty
                    ((vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_> *)
                     in_stack_fffffffffffffe20);
  if (bVar2) {
    in_stack_fffffffffffffe20 = (Logger *)&stack0xfffffffffffffe70;
    limonp::Logger::Logger
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
               in_stack_fffffffffffffe9c);
    poVar3 = limonp::Logger::Stream(in_stack_fffffffffffffe20);
    in_stack_fffffffffffffe28._M_current =
         (DictUnit *)std::operator<<(poVar3,"exp: [!static_node_infos_.empty()");
    std::operator<<((ostream *)in_stack_fffffffffffffe28._M_current,"] false. ");
    limonp::Logger::~Logger(in_stack_fffffffffffffe40);
  }
  std::vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>::vector
            (in_stack_fffffffffffffe60,
             (vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_> *)
             in_stack_fffffffffffffe58);
  std::vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>::begin
            (in_stack_fffffffffffffe08);
  std::vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>::end
            (in_stack_fffffffffffffe08);
  std::
  sort<__gnu_cxx::__normal_iterator<cppjieba::DictUnit*,std::vector<cppjieba::DictUnit,std::allocator<cppjieba::DictUnit>>>,bool(*)(cppjieba::DictUnit_const&,cppjieba::DictUnit_const&)>
            (in_RDI,in_stack_fffffffffffffe28,
             (_func_bool_DictUnit_ptr_DictUnit_ptr *)in_stack_fffffffffffffe20);
  this_00 = (vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_> *)
            &stack0xfffffffffffffe48;
  pvVar4 = std::vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>::operator[]
                     (this_00,0);
  *(double *)&(in_RDI._M_current)->field_0x78 = pvVar4->weight;
  sVar5 = std::vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>::size(this_00);
  pvVar4 = std::vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>::operator[]
                     (this_00,sVar5 - 1);
  *(double *)in_RDI._M_current[1].word.buffer_ = pvVar4->weight;
  sVar5 = std::vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>::size(this_00);
  pvVar4 = std::vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>::operator[]
                     (this_00,sVar5 >> 1);
  *(double *)(in_RDI._M_current[1].word.buffer_ + 2) = pvVar4->weight;
  if (in_ESI == 0) {
    uVar1 = *(undefined4 *)&(in_RDI._M_current)->field_0x7c;
    in_RDI._M_current[1].word.buffer_[4] = *(undefined4 *)&(in_RDI._M_current)->field_0x78;
    in_RDI._M_current[1].word.buffer_[5] = uVar1;
  }
  else if (in_ESI == 1) {
    *(undefined8 *)(in_RDI._M_current[1].word.buffer_ + 4) =
         *(undefined8 *)(in_RDI._M_current[1].word.buffer_ + 2);
  }
  else {
    *(undefined8 *)(in_RDI._M_current[1].word.buffer_ + 4) =
         *(undefined8 *)in_RDI._M_current[1].word.buffer_;
  }
  std::vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>::~vector
            ((vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_> *)
             in_stack_fffffffffffffe20);
  return;
}

Assistant:

void SetStaticWordWeights(UserWordWeightOption option) {
    XCHECK(!static_node_infos_.empty());
    vector<DictUnit> x = static_node_infos_;
    sort(x.begin(), x.end(), WeightCompare);
    min_weight_ = x[0].weight;
    max_weight_ = x[x.size() - 1].weight;
    median_weight_ = x[x.size() / 2].weight;
    switch (option) {
     case WordWeightMin:
       user_word_default_weight_ = min_weight_;
       break;
     case WordWeightMedian:
       user_word_default_weight_ = median_weight_;
       break;
     default:
       user_word_default_weight_ = max_weight_;
       break;
    }
  }